

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue JS_ReadSharedArrayBuffer(BCReaderState *s)

{
  JSContext *ctx;
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  JSValue JVar5;
  uint32_t byte_length;
  uint64_t u64;
  uint local_3c;
  JSValueUnion local_38;
  uint8_t *local_30;
  int64_t iVar4;
  
  ctx = s->ctx;
  iVar1 = bc_get_leb128(s,&local_3c);
  if (iVar1 == 0) {
    iVar1 = bc_get_u64(s,(uint64_t *)&local_30);
    if (iVar1 == 0) {
      JVar5 = js_array_buffer_constructor3
                        (ctx,(JSValue)(ZEXT816(3) << 0x40),(ulong)local_3c,0x14,local_30,
                         (JSFreeArrayBufferDataFunc *)0x0,(void *)0x0,0);
      iVar4 = JVar5.tag;
      local_38 = JVar5.u;
      if ((uint)JVar5.tag != 6) {
        iVar1 = BC_add_object_ref1(s,(JSObject *)local_38.ptr);
        if (iVar1 == 0) {
          uVar3 = (ulong)local_38.ptr & 0xffffffff00000000;
          uVar2 = (ulong)local_38.ptr & 0xffffffff;
          goto LAB_0013f5b4;
        }
      }
      if ((0xfffffff4 < (uint)JVar5.tag) &&
         (iVar1 = *local_38.ptr, *(int *)local_38.ptr = iVar1 + -1, iVar1 < 2)) {
        __JS_FreeValueRT(ctx->rt,JVar5);
      }
    }
  }
  uVar2 = 0;
  uVar3 = 0;
  iVar4 = 6;
LAB_0013f5b4:
  JVar5.u.ptr = (void *)(uVar2 | uVar3);
  JVar5.tag = iVar4;
  return JVar5;
}

Assistant:

static JSValue JS_ReadSharedArrayBuffer(BCReaderState *s)
{
    JSContext *ctx = s->ctx;
    uint32_t byte_length;
    uint8_t *data_ptr;
    JSValue obj;
    uint64_t u64;
    
    if (bc_get_leb128(s, &byte_length))
        return JS_EXCEPTION;
    if (bc_get_u64(s, &u64))
        return JS_EXCEPTION;
    data_ptr = (uint8_t *)(uintptr_t)u64;
    /* the SharedArrayBuffer is cloned */
    obj = js_array_buffer_constructor3(ctx, JS_UNDEFINED, byte_length,
                                       JS_CLASS_SHARED_ARRAY_BUFFER,
                                       data_ptr,
                                       NULL, NULL, FALSE);
    if (JS_IsException(obj))
        goto fail;
    if (BC_add_object_ref(s, obj))
        goto fail;
    return obj;
 fail:
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}